

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O3

void opengv::absolute_pose::modules::gpnp4::sPolynomial12
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
          m_storage.m_data.array[0x22a];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
          m_storage.m_data.array[0x278];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0xbb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x243] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x291] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0xd4] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x25c] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0xed] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x275] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2aa] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x106] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x28e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x11f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2a7] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x138] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x2c3] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x151] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x2dc] / dVar2;
  dVar3 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
          m_storage.m_data.array[0x2d9];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x183] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2c0] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2f5] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x19c] = dVar3 / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x1b5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2f2] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x1ce] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x30e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x200] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x30b] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x232] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x327] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x24b] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x340] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x27d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x324] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x359] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x296] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x33d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2af] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x356] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2c8] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x372] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2fa] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x36f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x32c] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x38b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x35e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x388] / dVar1;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::sPolynomial12( Eigen::Matrix<double,25,37> & groebnerMatrix )
{
  groebnerMatrix(12,7) = (groebnerMatrix(4,23)/(groebnerMatrix(4,22))-groebnerMatrix(7,26)/(groebnerMatrix(7,25)));
  groebnerMatrix(12,8) = groebnerMatrix(4,24)/(groebnerMatrix(4,22));
  groebnerMatrix(12,9) = (groebnerMatrix(4,25)/(groebnerMatrix(4,22))-groebnerMatrix(7,27)/(groebnerMatrix(7,25)));
  groebnerMatrix(12,10) = groebnerMatrix(4,26)/(groebnerMatrix(4,22));
  groebnerMatrix(12,11) = groebnerMatrix(4,27)/(groebnerMatrix(4,22));
  groebnerMatrix(12,12) = -groebnerMatrix(7,28)/(groebnerMatrix(7,25));
  groebnerMatrix(12,13) = -groebnerMatrix(7,29)/(groebnerMatrix(7,25));
  groebnerMatrix(12,15) = (groebnerMatrix(4,28)/(groebnerMatrix(4,22))-groebnerMatrix(7,30)/(groebnerMatrix(7,25)));
  groebnerMatrix(12,16) = groebnerMatrix(4,29)/(groebnerMatrix(4,22));
  groebnerMatrix(12,17) = groebnerMatrix(4,30)/(groebnerMatrix(4,22));
  groebnerMatrix(12,18) = -groebnerMatrix(7,31)/(groebnerMatrix(7,25));
  groebnerMatrix(12,20) = groebnerMatrix(4,31)/(groebnerMatrix(4,22));
  groebnerMatrix(12,22) = -groebnerMatrix(7,32)/(groebnerMatrix(7,25));
  groebnerMatrix(12,23) = -groebnerMatrix(7,33)/(groebnerMatrix(7,25));
  groebnerMatrix(12,25) = (groebnerMatrix(4,32)/(groebnerMatrix(4,22))-groebnerMatrix(7,34)/(groebnerMatrix(7,25)));
  groebnerMatrix(12,26) = groebnerMatrix(4,33)/(groebnerMatrix(4,22));
  groebnerMatrix(12,27) = groebnerMatrix(4,34)/(groebnerMatrix(4,22));
  groebnerMatrix(12,28) = -groebnerMatrix(7,35)/(groebnerMatrix(7,25));
  groebnerMatrix(12,30) = groebnerMatrix(4,35)/(groebnerMatrix(4,22));
  groebnerMatrix(12,32) = -groebnerMatrix(7,36)/(groebnerMatrix(7,25));
  groebnerMatrix(12,34) = groebnerMatrix(4,36)/(groebnerMatrix(4,22));
}